

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_eval.cpp
# Opt level: O1

ON_Plane * __thiscall
ON_SubDFace::ControlNetCenterFrame(ON_Plane *__return_storage_ptr__,ON_SubDFace *this)

{
  bool bVar1;
  long lVar2;
  ON_Plane *pOVar3;
  ON_Plane *pOVar4;
  byte bVar5;
  ON_3dVector N;
  ON_3dPoint C;
  ON_3dVector OStack_48;
  ON_3dPoint local_30;
  
  bVar5 = 0;
  ControlNetCenterPoint(&local_30,this);
  ControlNetCenterNormal(&OStack_48,this);
  bVar1 = ON_3dPoint::IsValid(&local_30);
  if ((bVar1) && (bVar1 = ON_3dVector::IsNotZero(&OStack_48), bVar1)) {
    ON_Plane::ON_Plane(__return_storage_ptr__);
    bVar1 = ON_Plane::CreateFromNormal(__return_storage_ptr__,&local_30,&OStack_48);
    if (bVar1) {
      return __return_storage_ptr__;
    }
    ON_Plane::~ON_Plane(__return_storage_ptr__);
  }
  pOVar3 = &ON_Plane::NanPlane;
  pOVar4 = __return_storage_ptr__;
  for (lVar2 = 0x10; lVar2 != 0; lVar2 = lVar2 + -1) {
    (pOVar4->origin).x = (pOVar3->origin).x;
    pOVar3 = (ON_Plane *)((long)pOVar3 + ((ulong)bVar5 * -2 + 1) * 8);
    pOVar4 = (ON_Plane *)((long)pOVar4 + (ulong)bVar5 * -0x10 + 8);
  }
  return __return_storage_ptr__;
}

Assistant:

const ON_Plane ON_SubDFace::ControlNetCenterFrame() const
{
  const ON_3dPoint C = ControlNetCenterPoint();
  const ON_3dVector N = ControlNetCenterNormal();
  if (C.IsValid() && N.IsNotZero())
  {
    // TODO - better choices for x and y axes
    ON_Plane center_frame;
    if (center_frame.CreateFromNormal(C, N))
      return center_frame;
  }
  return ON_Plane::NanPlane;
}